

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O2

mraa_led_context mraa_led_init(int index)

{
  mraa_led_context p_Var1;
  char *__fmt;
  
  if (plat == (mraa_board_t *)0x0) {
    __fmt = "led: init: platform not initialised";
  }
  else if (plat->led_dev_count == 0) {
    __fmt = "led: init: no led device defined in platform";
  }
  else if (index < 0) {
    __fmt = "led: init: led index cannot be negative";
  }
  else {
    if ((uint)index < plat->led_dev_count) {
      p_Var1 = mraa_led_init_internal(plat->led_dev[(uint)index].name);
      return p_Var1;
    }
    __fmt = "led: init: requested led above led device count";
  }
  syslog(3,__fmt);
  return (mraa_led_context)0x0;
}

Assistant:

mraa_led_context
mraa_led_init(int index)
{
    if (plat == NULL) {
        syslog(LOG_ERR, "led: init: platform not initialised");
        return NULL;
    }

    if (plat->led_dev_count == 0) {
        syslog(LOG_ERR, "led: init: no led device defined in platform");
        return NULL;
    }

    if (index < 0) {
        syslog(LOG_ERR, "led: init: led index cannot be negative");
        return NULL;
    }

    if (index >= plat->led_dev_count) {
        syslog(LOG_ERR, "led: init: requested led above led device count");
        return NULL;
    }

    return mraa_led_init_internal((char*) plat->led_dev[index].name);
}